

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecVec.h
# Opt level: O3

Vec_Vec_t * Vec_VecDupInt(Vec_Vec_t *p)

{
  int iVar1;
  void *pvVar2;
  Vec_Vec_t *pVVar3;
  void **ppvVar4;
  int *piVar5;
  void *__dest;
  ulong uVar6;
  size_t __size;
  int iVar7;
  size_t __size_00;
  int local_44;
  
  iVar7 = p->nSize;
  pVVar3 = (Vec_Vec_t *)malloc(0x10);
  local_44 = 8;
  if (6 < iVar7 - 1U) {
    local_44 = iVar7;
  }
  pVVar3->nSize = 0;
  pVVar3->nCap = local_44;
  if (local_44 == 0) {
    ppvVar4 = (void **)0x0;
  }
  else {
    ppvVar4 = (void **)malloc((long)local_44 << 3);
  }
  pVVar3->pArray = ppvVar4;
  if (0 < iVar7) {
    __size_00 = 0;
    iVar7 = 0;
    uVar6 = 0;
    do {
      pvVar2 = p->pArray[uVar6];
      piVar5 = (int *)malloc(0x10);
      iVar1 = *(int *)((long)pvVar2 + 4);
      piVar5[1] = iVar1;
      *piVar5 = iVar1;
      if ((long)iVar1 == 0) {
        __size = 0;
        __dest = (void *)0x0;
      }
      else {
        __size = (long)iVar1 << 2;
        __dest = malloc(__size);
      }
      *(void **)(piVar5 + 2) = __dest;
      memcpy(__dest,*(void **)((long)pvVar2 + 8),__size);
      if ((int)uVar6 == local_44) {
        ppvVar4 = pVVar3->pArray;
        if (uVar6 < 0x10) {
          if (ppvVar4 == (void **)0x0) {
            ppvVar4 = (void **)malloc(0x80);
          }
          else {
            ppvVar4 = (void **)realloc(ppvVar4,0x80);
          }
          pVVar3->pArray = ppvVar4;
          local_44 = 0x10;
        }
        else {
          if (ppvVar4 == (void **)0x0) {
            ppvVar4 = (void **)malloc(__size_00);
          }
          else {
            ppvVar4 = (void **)realloc(ppvVar4,__size_00);
          }
          pVVar3->pArray = ppvVar4;
          local_44 = iVar7;
        }
      }
      else {
        ppvVar4 = pVVar3->pArray;
      }
      ppvVar4[uVar6] = piVar5;
      uVar6 = uVar6 + 1;
      iVar7 = iVar7 + 2;
      __size_00 = __size_00 + 0x10;
    } while ((long)uVar6 < (long)p->nSize);
    pVVar3->nSize = (int)uVar6;
    pVVar3->nCap = local_44;
  }
  return pVVar3;
}

Assistant:

static inline Vec_Vec_t * Vec_VecDupInt( Vec_Vec_t * p )
{
    Vec_Ptr_t * vNew;
    Vec_Int_t * vVec;
    int i;
    vNew = Vec_PtrAlloc( Vec_VecSize(p) );
    Vec_VecForEachLevelInt( p, vVec, i )
        Vec_PtrPush( vNew, Vec_IntDup(vVec) );
    return (Vec_Vec_t *)vNew;
}